

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O2

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::CommonSubexpressionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,CommonSubexpressionCase *this,bool optimized)

{
  CaseShaderType CVar1;
  ProgramData *pPVar2;
  int iVar3;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  int local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string statements;
  string local_120;
  string precision;
  string local_e0;
  int numLoopIterations;
  CommonSubexpressionCase *local_a0;
  ProgramData *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_98 = __return_storage_ptr__;
  (anonymous_namespace)::getShaderPrecision_abi_cxx11_
            (&precision,(_anonymous_namespace_ *)(ulong)CVar1,
             (CaseShaderType)CONCAT71(in_register_00000011,optimized));
  local_a0 = this;
  switch(this->m_caseType) {
  case CASETYPE_SINGLE_STATEMENT:
    iVar3 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 3 + 1;
    if (!optimized) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,
                 "fract(sin(value) + cos(sin(value))) + sqrt(sin(value) + exp(cos(sin(value))))",
                 (allocator<char> *)&local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"\n\t      + ",(allocator<char> *)&local_180);
      repeat(&local_1c8,&local_228,iVar3,&local_208);
      std::operator+(&local_1e8,"\tvalue = ",&local_1c8);
      std::operator+(&statements,&local_1e8,";\n");
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      pbVar4 = &local_208;
      goto LAB_00409894;
    }
    std::operator+(&local_160,"\t",&precision);
    std::operator+(&local_180,&local_160," vec4 s = sin(value);\n\t");
    std::operator+(&local_1a8,&local_180,&precision);
    std::operator+(&local_208,&local_1a8," vec4 cs = cos(s);\n\t");
    std::operator+(&local_228,&local_208,&precision);
    std::operator+(&local_1c8,&local_228," vec4 d = fract(s + cs) + sqrt(s + exp(cs));\n\tvalue = ")
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"d",(allocator<char> *)&local_70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&numLoopIterations,"+",(allocator<char> *)&local_90);
    repeat(&local_e0,&local_120,iVar3,(string *)&numLoopIterations);
    std::operator+(&local_1e8,&local_1c8,&local_e0);
    std::operator+(&statements,&local_1e8,";\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&numLoopIterations);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    pbVar4 = &local_1a8;
LAB_004097e5:
    std::__cxx11::string::~string((string *)pbVar4);
    std::__cxx11::string::~string((string *)&local_180);
    pbVar4 = &local_160;
    break;
  case CASETYPE_MULTIPLE_STATEMENTS:
    iVar3 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (optimized) {
      std::operator+(&local_208,"\t",&precision);
      std::operator+(&local_228,&local_208," vec4 a = sin(value) + cos(exp(value));\n\t");
      std::operator+(&local_1c8,&local_228,&precision);
      std::operator+(&local_1e8,&local_1c8," vec4 b = cos(cos(a));\n\ta = fract(exp(sqrt(b)));\n\n")
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"\tvalue += a*b;\n",(allocator<char> *)&local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"",(allocator<char> *)&local_120);
      repeat(&local_1a8,&local_180,iVar3,&local_160);
      std::operator+(&statements,&local_1e8,&local_1a8);
LAB_00409184:
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      pbVar4 = &local_208;
    }
    else {
      std::operator+(&local_1a8,"\t",&precision);
      std::operator+(&local_208,&local_1a8," vec4 a${NDX} = sin(value) + cos(exp(value));\n\t");
      std::operator+(&local_228,&local_208,&precision);
      std::operator+(&local_1c8,&local_228,
                     " vec4 b${NDX} = cos(cos(a${NDX}));\n\ta${NDX} = fract(exp(sqrt(b${NDX})));\n\n"
                    );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"",(allocator<char> *)&numLoopIterations);
      repeatIndexedTemplate(&local_1e8,&local_1c8,iVar3,&local_180,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"\tvalue += a${NDX}*b${NDX};\n",(allocator<char> *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"",(allocator<char> *)&local_90);
      repeatIndexedTemplate(&local_160,&local_e0,iVar3,&local_120,0);
      std::operator+(&statements,&local_1e8,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      pbVar4 = &local_1a8;
    }
    break;
  case CASETYPE_STATIC_BRANCH:
    local_184 = (uint)(CVar1 == CASESHADERTYPE_VERTEX) * 2 + 2;
    if (optimized) {
      std::operator+(&local_208,"\t",&precision);
      std::operator+(&local_228,&local_208," vec4 a = sin(value) + cos(exp(value));\n\t");
      std::operator+(&local_1c8,&local_228,&precision);
      std::operator+(&local_1e8,&local_1c8,
                     " vec4 b = cos(a);\n\tb = cos(b);\n\ta = fract(exp(sqrt(b)));\n\n");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"\tvalue += a*b;\n",(allocator<char> *)&local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"",(allocator<char> *)&local_120);
      repeat(&local_1a8,&local_180,local_184,&local_160);
      std::operator+(&statements,&local_1e8,&local_1a8);
      goto LAB_00409184;
    }
    statements._M_dataplus._M_p = (pointer)&statements.field_2;
    statements._M_string_length = 0;
    statements.field_2._M_local_buf[0] = '\0';
    for (local_22c = 0; local_22c < local_184; local_22c = local_22c + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations,"\t",&precision);
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numLoopIterations," vec4 a");
      de::toString<int>(&local_70,&local_22c);
      std::operator+(&local_e0,&local_120,&local_70);
      std::operator+(&local_160,&local_e0," = sin(value) + cos(exp(value));\n\t");
      std::operator+(&local_180,&local_160,&precision);
      std::operator+(&local_1a8,&local_180," vec4 b");
      de::toString<int>(&local_90,&local_22c);
      std::operator+(&local_208,&local_1a8,&local_90);
      std::operator+(&local_228,&local_208," = cos(a");
      de::toString<int>(&local_50,&local_22c);
      std::operator+(&local_1c8,&local_228,&local_50);
      std::operator+(&local_1e8,&local_1c8,");\n");
      std::__cxx11::string::append((string *)&statements);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&numLoopIterations);
      iVar3 = local_22c % 3;
      if (iVar3 == 2) {
        de::toString<int>(&local_1a8,&local_22c);
        std::operator+(&local_208,"\tif (2 < 1);\n\telse\n\t\tb",&local_1a8);
        std::operator+(&local_228,&local_208," = cos(b");
        de::toString<int>(&local_180,&local_22c);
        std::operator+(&local_1c8,&local_228,&local_180);
        std::operator+(&local_1e8,&local_1c8,");\n");
        std::__cxx11::string::append((string *)&statements);
LAB_004095ac:
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        if (iVar3 == 1) {
          de::toString<int>(&local_1a8,&local_22c);
          std::operator+(&local_208,"\tb",&local_1a8);
          std::operator+(&local_228,&local_208," = cos(b");
          de::toString<int>(&local_180,&local_22c);
          std::operator+(&local_1c8,&local_228,&local_180);
          std::operator+(&local_1e8,&local_1c8,");\n");
          std::__cxx11::string::append((string *)&statements);
          goto LAB_004095ac;
        }
        if (iVar3 == 0) {
          de::toString<int>(&local_1a8,&local_22c);
          std::operator+(&local_208,"\tif (1 < 2)\n\t\tb",&local_1a8);
          std::operator+(&local_228,&local_208," = cos(b");
          de::toString<int>(&local_180,&local_22c);
          std::operator+(&local_1c8,&local_228,&local_180);
          std::operator+(&local_1e8,&local_1c8,");\n");
          std::__cxx11::string::append((string *)&statements);
          goto LAB_004095ac;
        }
      }
      de::toString<int>(&local_1a8,&local_22c);
      std::operator+(&local_208,"\ta",&local_1a8);
      std::operator+(&local_228,&local_208," = fract(exp(sqrt(b");
      de::toString<int>(&local_180,&local_22c);
      std::operator+(&local_1c8,&local_228,&local_180);
      std::operator+(&local_1e8,&local_1c8,")));\n\n");
      std::__cxx11::string::append((string *)&statements);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"\tvalue += a${NDX}*b${NDX};\n",(allocator<char> *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"",(allocator<char> *)&local_1a8);
    repeatIndexedTemplate(&local_1e8,&local_1c8,local_184,&local_228,0);
    std::__cxx11::string::append((string *)&statements);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_228);
    pbVar4 = &local_1c8;
    break;
  case CASETYPE_LOOP:
    numLoopIterations = 4;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      numLoopIterations = 0x20;
    }
    if (!optimized) {
      std::operator+(&local_160,"\t",&precision);
      std::operator+(&local_180,&local_160," vec4 acc0 = value;\n\tfor (int i = 0; i < ");
      de::toString<int>(&local_e0,&numLoopIterations);
      std::operator+(&local_1a8,&local_180,&local_e0);
      std::operator+(&local_208,&local_1a8,"; i++)\n\t\tacc0 = sin(acc0);\n\n\t");
      std::operator+(&local_228,&local_208,&precision);
      std::operator+(&local_1c8,&local_228," vec4 acc1 = value;\n\tfor (int i = 0; i < ");
      de::toString<int>(&local_120,&numLoopIterations);
      std::operator+(&local_1e8,&local_1c8,&local_120);
      std::operator+(&statements,&local_1e8,
                     "; i++)\n\t\tacc1 = sin(acc1);\n\n\tvalue += acc0;\n\tvalue += acc1;\n");
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1a8);
      pbVar4 = &local_e0;
      goto LAB_004097e5;
    }
    std::operator+(&local_228,"\t",&precision);
    std::operator+(&local_1c8,&local_228," vec4 acc = value;\n\tfor (int i = 0; i < ");
    de::toString<int>(&local_208,&numLoopIterations);
    std::operator+(&local_1e8,&local_1c8,&local_208);
    std::operator+(&statements,&local_1e8,
                   "; i++)\n\t\tacc = sin(acc);\n\n\tvalue += acc;\n\tvalue += acc;\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    pbVar4 = &local_1c8;
LAB_00409894:
    std::__cxx11::string::~string((string *)pbVar4);
    pbVar4 = &local_228;
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&statements,(char *)0x0,(allocator<char> *)&local_1e8);
    goto LAB_00409a94;
  }
  std::__cxx11::string::~string((string *)pbVar4);
LAB_00409a94:
  pPVar2 = local_98;
  defaultProgramData(local_98,(local_a0->super_ShaderOptimizationCase).m_caseShaderType,&statements)
  ;
  std::__cxx11::string::~string((string *)&statements);
  std::__cxx11::string::~string((string *)&precision);
  return pPVar2;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_SINGLE_STATEMENT		? singleStatementCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_MULTIPLE_STATEMENTS	? multipleStatementsCaseStatements	(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_STATIC_BRANCH			? staticBranchCaseStatements		(optimized, precision, isVertexCase)
										: m_caseType == CASETYPE_LOOP					? loopCaseStatements				(optimized, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}